

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

void reportError(string *message,Node *node)

{
  ostream *poVar1;
  runtime_error *this;
  Node *in_RSI;
  string *in_RDI;
  stringstream ss;
  Mark mark;
  string local_1f0 [32];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [312];
  Mark *in_stack_ffffffffffffffa8;
  
  Node::getMark(in_RSI);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"ERROR (");
  Mark::to_string_abi_cxx11_(in_stack_ffffffffffffffa8);
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1,"): ");
  std::operator<<(poVar1,in_RDI);
  std::__cxx11::string::~string(local_1d0);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1f0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]]
void reportError(const std::string& message, const Node& node)
{
  const auto mark = node.getMark();
  std::stringstream ss;
  ss << "ERROR (" << mark.to_string() << "): " << message;
  throw std::runtime_error(ss.str());
}